

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_com.c
# Opt level: O2

MPP_RET hal_vp9d_prob_default(void *buf,void *dxva)

{
  ushort uVar1;
  RK_U64 *data;
  long lVar2;
  int iVar3;
  vp9_prob (*pavVar4) [3];
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  BitputCtx_t bp;
  long local_a8;
  vp9_prob partition_probs [16] [3];
  
  uVar1 = *(ushort *)((long)dxva + 2);
  memset(buf,0,0x1300);
  if ((uVar1 & 0x81) != 1) {
    *(undefined2 *)((long)dxva + 0x187) = 0xd34;
    *(undefined4 *)((long)dxva + 0x183) = 0x5258803;
    *(undefined8 *)((long)dxva + 0x189) = 0x80c04264650f9814;
    *(undefined1 *)((long)dxva + 0x191) = 0x40;
    memcpy((void *)((long)dxva + 0x207),vp9_default_coef_probs,0x6c0);
  }
  partition_probs._0_8_ = *(undefined8 *)((long)dxva + 0x1d7);
  partition_probs._8_8_ = *(undefined8 *)((long)dxva + 0x1df);
  partition_probs._16_8_ = *(undefined8 *)((long)dxva + 0x1e7);
  partition_probs._24_8_ = *(undefined8 *)((long)dxva + 0x1ef);
  partition_probs._32_8_ = *(undefined8 *)((long)dxva + 0x1f7);
  partition_probs._40_8_ = *(undefined8 *)((long)dxva + 0x1ff);
  pavVar4 = partition_probs;
  data = (RK_U64 *)mpp_osal_calloc("hal_vp9d_prob_default",0x1300);
  memset(data,0,0x260);
  mpp_set_bitput_ctx(&bp,data,0x260);
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      mpp_put_bits(&bp,(ulong)(*pavVar4)[lVar9],8);
    }
    pavVar4 = pavVar4 + 1;
  }
  iVar3 = 3;
  while (bVar12 = iVar3 != 0, iVar3 = iVar3 + -1, bVar12) {
    mpp_put_bits(&bp,0,8);
  }
  iVar3 = 7;
  while (bVar12 = iVar3 != 0, iVar3 = iVar3 + -1, bVar12) {
    mpp_put_bits(&bp,0,8);
  }
  for (lVar7 = -3; lVar7 != 0; lVar7 = lVar7 + 1) {
    mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar7 + 0x192),8);
  }
  lVar7 = (long)dxva + 0x183;
  for (lVar9 = 0; lVar10 = -3, lVar9 != 2; lVar9 = lVar9 + 1) {
    for (; lVar10 != 0; lVar10 = lVar10 + 1) {
      mpp_put_bits(&bp,(ulong)*(byte *)(lVar7 + 3 + lVar10),8);
    }
    lVar7 = lVar7 + 3;
  }
  lVar7 = (long)dxva + 0x189;
  for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      mpp_put_bits(&bp,(ulong)*(byte *)(lVar7 + lVar10),8);
    }
    lVar7 = lVar7 + 2;
  }
  for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
    mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar7 + 0x18d),8);
  }
  for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
    mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar7 + 0x16b),8);
  }
  lVar7 = (long)dxva + 0xd0;
  mpp_put_align(&bp,0x80,0);
  for (lVar9 = 0; lVar10 = -9, lVar9 != 4; lVar9 = lVar9 + 1) {
    for (; lVar10 != 0; lVar10 = lVar10 + 1) {
      mpp_put_bits(&bp,(ulong)*(byte *)(lVar7 + 9 + lVar10),8);
    }
    lVar7 = lVar7 + 9;
  }
  for (lVar7 = -5; lVar7 != 0; lVar7 = lVar7 + 1) {
    mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar7 + 0x174),8);
  }
  for (lVar7 = -5; lVar7 != 0; lVar7 = lVar7 + 1) {
    mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar7 + 0x183),8);
  }
  lVar7 = (long)dxva + 0x174;
  for (lVar9 = 0; lVar9 != 5; lVar9 = lVar9 + 1) {
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      mpp_put_bits(&bp,(ulong)*(byte *)(lVar7 + lVar10),8);
    }
    lVar7 = lVar7 + 2;
  }
  lVar7 = (long)dxva + 0x156;
  for (lVar9 = 0; lVar10 = -3, lVar9 != 7; lVar9 = lVar9 + 1) {
    for (; lVar10 != 0; lVar10 = lVar10 + 1) {
      mpp_put_bits(&bp,(ulong)*(byte *)(lVar7 + 3 + lVar10),8);
    }
    lVar7 = lVar7 + 3;
  }
  lVar7 = (long)dxva + 0x14e;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      mpp_put_bits(&bp,(ulong)*(byte *)(lVar7 + lVar10),8);
    }
    lVar7 = lVar7 + 2;
  }
  mpp_put_align(&bp,0x80,0);
  local_a8 = (long)dxva + 0x207;
  for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
    lVar9 = local_a8;
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      iVar3 = 0;
      lVar6 = lVar9;
      for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
        lVar5 = lVar6;
        for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
          for (lVar11 = -3; lVar11 != 0; lVar11 = lVar11 + 1) {
            mpp_put_bits(&bp,(ulong)*(byte *)(lVar5 + 3 + lVar11),8);
            iVar3 = iVar3 + 1;
            if (iVar3 == 0x1b) {
              iVar3 = 0;
              mpp_put_align(&bp,0x80,0);
            }
          }
          lVar5 = lVar5 + 3;
        }
        lVar6 = lVar6 + 0x12;
      }
      mpp_put_align(&bp,0x80,0);
      lVar9 = lVar9 + 0xd8;
    }
    local_a8 = local_a8 + 0x1b0;
  }
  local_a8 = (long)dxva + 0x273;
  for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
    lVar9 = local_a8;
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      iVar3 = 0;
      lVar6 = lVar9;
      for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
        lVar5 = lVar6;
        for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
          for (lVar11 = -3; lVar11 != 0; lVar11 = lVar11 + 1) {
            mpp_put_bits(&bp,(ulong)*(byte *)(lVar5 + 3 + lVar11),8);
            iVar3 = iVar3 + 1;
            if (iVar3 == 0x1b) {
              iVar3 = 0;
              mpp_put_align(&bp,0x80,0);
            }
          }
          lVar5 = lVar5 + 3;
        }
        lVar6 = lVar6 + 0x12;
      }
      mpp_put_align(&bp,0x80,0);
      lVar9 = lVar9 + 0xd8;
    }
    local_a8 = local_a8 + 0x1b0;
  }
  lVar7 = (long)dxva + 0xf4;
  for (lVar9 = 0; lVar10 = -9, lVar9 != 3; lVar9 = lVar9 + 1) {
    for (; lVar10 != 0; lVar10 = lVar10 + 1) {
      mpp_put_bits(&bp,(ulong)*(byte *)(lVar7 + 9 + lVar10),8);
    }
    lVar7 = lVar7 + 9;
  }
  mpp_put_align(&bp,0x80,0);
  lVar7 = (long)dxva + 0x10f;
  for (lVar9 = 3; lVar10 = -9, lVar9 != 6; lVar9 = lVar9 + 1) {
    for (; lVar10 != 0; lVar10 = lVar10 + 1) {
      mpp_put_bits(&bp,(ulong)*(byte *)(lVar7 + 9 + lVar10),8);
    }
    lVar7 = lVar7 + 9;
  }
  mpp_put_align(&bp,0x80,0);
  lVar7 = (long)dxva + 0x12a;
  for (lVar9 = 6; lVar10 = -9, lVar9 != 9; lVar9 = lVar9 + 1) {
    for (; lVar10 != 0; lVar10 = lVar10 + 1) {
      mpp_put_bits(&bp,(ulong)*(byte *)(lVar7 + 9 + lVar10),8);
    }
    lVar7 = lVar7 + 9;
  }
  mpp_put_align(&bp,0x80,0);
  for (lVar7 = -9; lVar7 != 0; lVar7 = lVar7 + 1) {
    mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar7 + 0x14e),8);
  }
  mpp_put_align(&bp,0x80,0);
  mpp_put_bits(&bp,0,8);
  mpp_put_align(&bp,0x80,0);
  for (lVar7 = -3; lVar7 != 0; lVar7 = lVar7 + 1) {
    mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar7 + 0x195),8);
  }
  for (lVar7 = 0; lVar7 != 0x42; lVar7 = lVar7 + 0x21) {
    mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar7 + 0x195),8);
  }
  lVar7 = (long)dxva + 0x196;
  for (lVar9 = 0; lVar10 = -10, lVar9 != 2; lVar9 = lVar9 + 1) {
    for (; lVar10 != 0; lVar10 = lVar10 + 1) {
      mpp_put_bits(&bp,(ulong)*(byte *)(lVar7 + 10 + lVar10),8);
    }
    lVar7 = lVar7 + 0x21;
  }
  for (lVar7 = 0; lVar7 != 0x42; lVar7 = lVar7 + 0x21) {
    mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar7 + 0x1a0),8);
  }
  lVar7 = (long)dxva + 0x1a1;
  for (lVar9 = 0; lVar10 = -10, lVar9 != 2; lVar9 = lVar9 + 1) {
    for (; lVar10 != 0; lVar10 = lVar10 + 1) {
      mpp_put_bits(&bp,(ulong)*(byte *)(lVar7 + 10 + lVar10),8);
    }
    lVar7 = lVar7 + 0x21;
  }
  lVar7 = (long)dxva + 0x1ab;
  for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
    lVar10 = lVar7;
    for (lVar6 = 0; lVar2 = -3, lVar6 != 2; lVar6 = lVar6 + 1) {
      for (; lVar2 != 0; lVar2 = lVar2 + 1) {
        mpp_put_bits(&bp,(ulong)*(byte *)(lVar10 + 3 + lVar2),8);
      }
      lVar10 = lVar10 + 3;
    }
    lVar7 = lVar7 + 0x21;
  }
  lVar7 = (long)dxva + 0x1b1;
  for (lVar9 = 0; lVar10 = -3, lVar9 != 2; lVar9 = lVar9 + 1) {
    for (; lVar10 != 0; lVar10 = lVar10 + 1) {
      mpp_put_bits(&bp,(ulong)*(byte *)(lVar7 + 3 + lVar10),8);
    }
    lVar7 = lVar7 + 0x21;
  }
  for (lVar7 = 0; lVar7 != 0x42; lVar7 = lVar7 + 0x21) {
    mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar7 + 0x1b4),8);
  }
  for (lVar7 = 0; lVar7 != 0x42; lVar7 = lVar7 + 0x21) {
    mpp_put_bits(&bp,(ulong)*(byte *)((long)dxva + lVar7 + 0x1b5),8);
  }
  mpp_put_align(&bp,0x80,0);
  mpp_put_bits(&bp,0,8);
  mpp_put_align(&bp,0x80,0);
  memcpy(buf,data,0x1300);
  mpp_osal_free("hal_vp9d_prob_default",data);
  return MPP_OK;
}

Assistant:

MPP_RET hal_vp9d_prob_default(void *buf, void *dxva)
{
    RK_S32 i, j, k, m, n;
    RK_S32 fifo_len = PROB_SIZE >> 3;
    RK_U64 *probe_packet = NULL;
    BitputCtx_t bp;
    DXVA_PicParams_VP9 *pic_param = (DXVA_PicParams_VP9*)dxva;
    RK_S32 intraFlag = (!pic_param->frame_type || pic_param->intra_only);
    vp9_prob partition_probs[PARTITION_CONTEXTS][PARTITION_TYPES - 1];
    memset(buf, 0, PROB_SIZE);

    if (intraFlag) {
        memcpy(&pic_param->prob.tx32p, &vp9_default_probs.tx32p, sizeof(vp9_default_probs.tx32p));
        memcpy(&pic_param->prob.tx16p, &vp9_default_probs.tx16p, sizeof(vp9_default_probs.tx16p));
        memcpy(&pic_param->prob.tx8p,  &vp9_default_probs.tx8p, sizeof(vp9_default_probs.tx8p));
        memcpy(&pic_param->prob.skip,  &vp9_default_probs.skip, sizeof(vp9_default_probs.skip));
        memcpy(&pic_param->prob.coef,  &vp9_default_coef_probs, sizeof(vp9_default_coef_probs));
    }
    memcpy(partition_probs, pic_param->prob.partition, sizeof(partition_probs));

    probe_packet = mpp_calloc(RK_U64, fifo_len);
    memset(probe_packet, 0, fifo_len);
    mpp_set_bitput_ctx(&bp, probe_packet, fifo_len);

    //sb info  5 x 128 bit
    for (i = 0; i < 16; i++) //kf_partition_prob
        for (j = 0; j < 3; j++)
            mpp_put_bits(&bp, partition_probs[i][j], 8); //48

    for (i = 0; i < PREDICTION_PROBS; i++) //Segment_id_pred_prob //3
        mpp_put_bits(&bp, 0, 8);

    for (i = 0; i < SEG_TREE_PROBS; i++) //Segment_id_probs
        mpp_put_bits(&bp, 0, 8); //7

    for (i = 0; i < SKIP_CONTEXTS; i++) //Skip_flag_probs //3
        mpp_put_bits(&bp, pic_param->prob.skip[i], 8);

    for (i = 0; i < TX_SIZE_CONTEXTS; i++) //Tx_size_probs //6
        for (j = 0; j < TX_SIZES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.tx32p[i][j], 8);

    for (i = 0; i < TX_SIZE_CONTEXTS; i++) //Tx_size_probs //4
        for (j = 0; j < TX_SIZES - 2; j++)
            mpp_put_bits(&bp, pic_param->prob.tx16p[i][j], 8);

    for (i = 0; i < TX_SIZE_CONTEXTS; i++) //Tx_size_probs //2
        mpp_put_bits(&bp, pic_param->prob.tx8p[i], 8);

    for (i = 0; i < INTRA_INTER_CONTEXTS; i++) //Tx_size_probs //4
        mpp_put_bits(&bp, pic_param->prob.intra[i], 8);

    mpp_put_align(&bp, 128, 0);

    //intra_y_mode & inter_block info   6 x 128 bit
    for (i = 0; i < BLOCK_SIZE_GROUPS; i++) //intra_y_mode
        for (j = 0; j < INTRA_MODES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.y_mode[i][j], 8);

    for (i = 0; i < COMP_INTER_CONTEXTS; i++) //reference_mode prob
        mpp_put_bits(&bp, pic_param->prob.comp[i], 8);

    for (i = 0; i < REF_CONTEXTS; i++) //comp ref bit
        mpp_put_bits(&bp, pic_param->prob.comp_ref[i], 8);

    for (i = 0; i < REF_CONTEXTS; i++) //single ref bit
        for (j = 0; j < 2; j++)
            mpp_put_bits(&bp, pic_param->prob.single_ref[i][j], 8);

    for (i = 0; i < INTER_MODE_CONTEXTS; i++) //mv mode bit
        for (j = 0; j < INTER_MODES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.mv_mode[i][j], 8);


    for (i = 0; i < SWITCHABLE_FILTER_CONTEXTS; i++) //comp ref bit
        for (j = 0; j < SWITCHABLE_FILTERS - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.filter[i][j], 8);

    mpp_put_align(&bp, 128, 0);

    //128 x 128bit
    //coeff releated
    for (i = 0; i < TX_SIZES; i++)
        for (j = 0; j < PLANE_TYPES; j++) {
            RK_S32 byte_count = 0;
            for (k = 0; k < COEF_BANDS; k++) {
                for (m = 0; m < COEFF_CONTEXTS; m++)
                    for (n = 0; n < UNCONSTRAINED_NODES; n++) {
                        mpp_put_bits(&bp, pic_param->prob.coef[i][j][0][k][m][n], 8);
                        byte_count++;
                        if (byte_count == 27) {
                            mpp_put_align(&bp, 128, 0);
                            byte_count = 0;
                        }
                    }
            }
            mpp_put_align(&bp, 128, 0);
        }
    for (i = 0; i < TX_SIZES; i++)
        for (j = 0; j < PLANE_TYPES; j++) {
            RK_S32 byte_count = 0;
            for (k = 0; k < COEF_BANDS; k++) {
                for (m = 0; m < COEFF_CONTEXTS; m++) {
                    for (n = 0; n < UNCONSTRAINED_NODES; n++) {
                        mpp_put_bits(&bp, pic_param->prob.coef[i][j][1][k][m][n], 8);
                        byte_count++;
                        if (byte_count == 27) {
                            mpp_put_align(&bp, 128, 0);
                            byte_count = 0;
                        }
                    }

                }
            }
            mpp_put_align(&bp, 128, 0);
        }

    //intra uv mode 6 x 128
    for (i = 0; i < 3; i++) //intra_uv_mode
        for (j = 0; j < INTRA_MODES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.uv_mode[i][j], 8);
    mpp_put_align(&bp, 128, 0);

    for (; i < 6; i++) //intra_uv_mode
        for (j = 0; j < INTRA_MODES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.uv_mode[i][j], 8);
    mpp_put_align(&bp, 128, 0);

    for (; i < 9; i++) //intra_uv_mode
        for (j = 0; j < INTRA_MODES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.uv_mode[i][j], 8);
    mpp_put_align(&bp, 128, 0);
    for (; i < INTRA_MODES; i++) //intra_uv_mode
        for (j = 0; j < INTRA_MODES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.uv_mode[i][j], 8);

    mpp_put_align(&bp, 128, 0);
    mpp_put_bits(&bp, 0, 8);
    mpp_put_align(&bp, 128, 0);

    //mv releated 6 x 128
    for (i = 0; i < MV_JOINTS - 1; i++) //mv_joint_type
        mpp_put_bits(&bp, pic_param->prob.mv_joint[i], 8);

    for (i = 0; i < 2; i++) { //sign bit
        mpp_put_bits(&bp, pic_param->prob.mv_comp[i].sign, 8);
    }
    for (i = 0; i < 2; i++) { //classes bit
        for (j = 0; j < MV_CLASSES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].classes[j], 8);
    }
    for (i = 0; i < 2; i++) { //classe0 bit
        mpp_put_bits(&bp, pic_param->prob.mv_comp[i].class0, 8);
    }
    for (i = 0; i < 2; i++) { // bits
        for (j = 0; j < MV_OFFSET_BITS; j++)
            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].bits[j], 8);
    }
    for (i = 0; i < 2; i++) { //class0_fp bit
        for (j = 0; j < CLASS0_SIZE; j++)
            for (k = 0; k < MV_FP_SIZE - 1; k++)
                mpp_put_bits(&bp, pic_param->prob.mv_comp[i].class0_fp[j][k], 8);
    }
    for (i = 0; i < 2; i++) { //comp ref bit
        for (j = 0; j < MV_FP_SIZE - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].fp[j], 8);
    }
    for (i = 0; i < 2; i++) { //class0_hp bit

        mpp_put_bits(&bp, pic_param->prob.mv_comp[i].class0_hp, 8);
    }
    for (i = 0; i < 2; i++) { //hp bit
        mpp_put_bits(&bp, pic_param->prob.mv_comp[i].hp, 8);
    }
    mpp_put_align(&bp, 128, 0);
    mpp_put_bits(&bp, 0, 8);
    mpp_put_align(&bp, 128, 0);

    memcpy(buf, probe_packet, fifo_len << 3);

#if VP9_DUMP
    {
        static RK_U32 file_cnt = 0;
        char file_name[128];
        sprintf(file_name, "/data/vp9/prob_default_%d.txt", file_cnt);
        FILE *vp9_fp = fopen(file_name, "wb");
        RK_U32 *tmp = (RK_U32 *)buf;
        for (i = 0; i < bp.index * 2; i += 2) {
            fprintf(vp9_fp, "%08x%08x\n", tmp[i + 1], tmp[i]);
        }
        file_cnt++;
        fflush(vp9_fp);
        fclose(vp9_fp);
    }
#endif
    MPP_FREE(probe_packet);

    return 0;
}